

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O1

void Cudd_RecursiveDeref(DdManager *table,DdNode *n)

{
  uint *puVar1;
  int iVar2;
  DdNode **ppDVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  DdNode *pDVar7;
  anon_union_16_2_50f58667_for_type *paVar8;
  
  uVar4 = table->keys - table->dead;
  if (table->peakLiveNodes < uVar4) {
    table->peakLiveNodes = uVar4;
  }
  ppDVar3 = table->stack;
  pDVar7 = (DdNode *)((ulong)n & 0xfffffffffffffffe);
  iVar5 = 1;
  do {
    if (pDVar7->ref == 1) {
      pDVar7->ref = 0;
      table->dead = table->dead + 1;
      if ((ulong)pDVar7->index == 0x7fffffff) {
        puVar1 = &(table->constants).dead;
        *puVar1 = *puVar1 + 1;
        goto LAB_007ef267;
      }
      iVar2 = table->perm[pDVar7->index];
      paVar8 = &pDVar7->type;
      lVar6 = (long)iVar5;
      iVar5 = iVar5 + 1;
      ppDVar3[lVar6] = (DdNode *)((ulong)(pDVar7->type).kids.E & 0xfffffffffffffffe);
      puVar1 = &table->subtables[iVar2].dead;
      *puVar1 = *puVar1 + 1;
    }
    else {
      pDVar7->ref = pDVar7->ref - 1;
LAB_007ef267:
      lVar6 = (long)iVar5;
      iVar5 = iVar5 + -1;
      paVar8 = (anon_union_16_2_50f58667_for_type *)(ppDVar3 + lVar6 + -1);
    }
    pDVar7 = (paVar8->kids).T;
    if (iVar5 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void
Cudd_RecursiveDeref(
  DdManager * table,
  DdNode * n)
{
    DdNode *N;
    int ord;
    DdNodePtr *stack = table->stack;
    int SP = 1;

    unsigned int live = table->keys - table->dead;
    if (live > table->peakLiveNodes) {
        table->peakLiveNodes = live;
    }

    N = Cudd_Regular(n);

    do {
#ifdef DD_DEBUG
        assert(N->ref != 0);
#endif

        if (N->ref == 1) {
            N->ref = 0;
            table->dead++;
#ifdef DD_STATS
            table->nodesDropped++;
#endif
            if (cuddIsConstant(N)) {
                table->constants.dead++;
                N = stack[--SP];
            } else {
                ord = table->perm[N->index];
                stack[SP++] = Cudd_Regular(cuddE(N));
                table->subtables[ord].dead++;
                N = cuddT(N);
            }
        } else {
            cuddSatDec(N->ref);
            N = stack[--SP];
        }
    } while (SP != 0);

}